

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O0

void __thiscall
doctest::AssertData::StringContains::StringContains(StringContains *this,StringContains *param_2)

{
  Contains *in_RSI;
  Contains *in_RDI;
  
  Contains::Contains(in_RSI,in_RDI);
  in_RDI[1].string.field_0.buf[0] = in_RSI[1].string.field_0.buf[0] & 1;
  return;
}

Assistant:

class DOCTEST_INTERFACE StringContains {
        private:
            Contains content;
            bool isContains;

        public:
            StringContains(const String& str) : content(str), isContains(false) { }
            StringContains(Contains cntn) : content(static_cast<Contains&&>(cntn)), isContains(true) { }

            bool check(const String& str) { return isContains ? (content == str) : (content.string == str); }

            operator const String&() const { return content.string; }

            const char* c_str() const { return content.string.c_str(); }
    }